

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

bool __thiscall QSplitter::restoreState(QSplitter *this,QByteArray *state)

{
  QSplitterPrivate *this_00;
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool bVar3;
  qint32 v;
  qint32 marker;
  qint32 i;
  bool b;
  QArrayDataPointer<int> local_88;
  QArrayDataPointer<char> local_70;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSplitterPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  local_70.d = (state->d).d;
  local_70.ptr = (state->d).ptr;
  local_70.size = (state->d).size;
  if (local_70.d != (Data *)0x0) {
    LOCK();
    ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_58,&local_70,1);
  uStack_40 = 0xd;
  local_88.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (int *)0x0;
  b = true;
  i = -0x55555556;
  marker = -0x55555556;
  v = -0x55555556;
  QDataStream::operator>>((QDataStream *)&local_58,&marker);
  QDataStream::operator>>((QDataStream *)&local_58,&v);
  bVar3 = marker == 0xff;
  bVar2 = v < 2;
  if (bVar2 && bVar3) {
    QtPrivate::readArrayBasedContainer<QList<int>>((QDataStream *)&local_58,(QList<int> *)&local_88)
    ;
    QSplitterPrivate::setSizes_helper(this_00,(QList<int> *)&local_88,false);
    QDataStream::operator>>((QDataStream *)&local_58,&b);
    *(bool *)(*(long *)&(this->super_QFrame).super_QWidget.field_0x8 + 0x2a6) = b;
    QDataStream::operator>>((QDataStream *)&local_58,&i);
    setHandleWidth(this,i);
    QDataStream::operator>>((QDataStream *)&local_58,&b);
    lVar1 = *(long *)&(this->super_QFrame).super_QWidget.field_0x8;
    *(undefined1 *)(lVar1 + 0x2ad) = 1;
    *(bool *)(lVar1 + 0x2a4) = b;
    QDataStream::operator>>((QDataStream *)&local_58,&i);
    setOrientation(this,i);
    QSplitterPrivate::doResize(this_00);
    if (0 < v) {
      QDataStream::operator>>((QDataStream *)&local_58,&this_00->opaqueResizeSet);
    }
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&local_88);
  QDataStream::~QDataStream((QDataStream *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2 && bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QSplitter::restoreState(const QByteArray &state)
{
    Q_D(QSplitter);
    int version = 1;
    QByteArray sd = state;
    QDataStream stream(&sd, QIODevice::ReadOnly);
    stream.setVersion(QDataStream::Qt_5_0);
    QList<int> list;
    bool b;
    qint32 i;
    qint32 marker;
    qint32 v;

    stream >> marker;
    stream >> v;
    if (marker != SplitterMagic || v > version)
        return false;

    stream >> list;
    d->setSizes_helper(list, false);

    stream >> b;
    setChildrenCollapsible(b);

    stream >> i;
    setHandleWidth(i);

    stream >> b;
    setOpaqueResize(b);

    stream >> i;
    setOrientation(Qt::Orientation(i));
    d->doResize();

    if (v >= 1)
        stream >> d->opaqueResizeSet;

    return true;
}